

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferPrecision.cpp
# Opt level: O0

IterateResult __thiscall glcts::TextureBufferPrecision::iterate(TextureBufferPrecision *this)

{
  bool bVar1;
  bool bVar2;
  GLboolean GVar3;
  ContextType ctxType;
  ApiType AVar4;
  NotSupportedError *this_00;
  RenderContext *pRVar5;
  bool local_10e;
  bool local_10c;
  bool local_10b;
  bool local_109;
  char *local_f8;
  char *fs_code_with_global_precision [4];
  char *fs_code_with_precision [3];
  char *local_b8;
  char *fs_code_without_precision [3];
  char *pcStack_98;
  GLuint i_1;
  char *cs_code_with_global_precision [4];
  char *cs_code_with_precision [3];
  char *local_58;
  char *cs_code_without_precision [3];
  GLuint i;
  GLint expected_fail;
  GLboolean test_passed;
  ContextType contextType;
  TextureBufferPrecision *this_local;
  
  if (((this->super_TestCaseBase).m_is_texture_buffer_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture buffer functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferPrecision.cpp"
               ,0x121);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  local_10b = true;
  bVar1 = glu::glslVersionIsES((this->super_TestCaseBase).m_glslVersion);
  AVar4 = glu::ApiType::core(4,5);
  bVar2 = glu::contextSupports(ctxType,AVar4);
  if (!bVar2) {
    AVar4 = glu::ApiType::es(3,1);
    bVar2 = glu::contextSupports(ctxType,AVar4);
    if (!bVar2) goto LAB_01653eb8;
  }
  for (cs_code_without_precision[2]._4_4_ = 0; cs_code_without_precision[2]._4_4_ < 3;
      cs_code_without_precision[2]._4_4_ = cs_code_without_precision[2]._4_4_ + 1) {
    local_58 = "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\n";
    cs_code_without_precision[0] =
         *(char **)(m_cs_code_declaration_without_precision +
                   (ulong)cs_code_without_precision[2]._4_4_ * 8);
    cs_code_without_precision[1] =
         "\nvoid main()\n{\n    computeSSBO.value = imageLoad(image_buffer, 0).x;\n}";
    cs_code_with_global_precision[3] = "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\n";
    pcStack_98 = "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\n";
    cs_code_with_global_precision[0] =
         *(char **)(m_cs_code_global_precision + (ulong)cs_code_without_precision[2]._4_4_ * 8);
    cs_code_with_global_precision[1] =
         *(char **)(m_cs_code_declaration_without_precision +
                   (ulong)cs_code_without_precision[2]._4_4_ * 8);
    cs_code_with_global_precision[2] =
         "\nvoid main()\n{\n    computeSSBO.value = imageLoad(image_buffer, 0).x;\n}";
    GVar3 = verifyShaderCompilationStatus(this,0x91b9,&local_58,3,(uint)!bVar1);
    local_109 = GVar3 != '\0' && local_10b;
    GVar3 = verifyShaderCompilationStatus(this,0x91b9,cs_code_with_global_precision + 3,3,1);
    local_10b = false;
    if (GVar3 != '\0') {
      local_10b = local_109;
    }
    GVar3 = verifyShaderCompilationStatus(this,0x91b9,&stack0xffffffffffffff68,4,1);
    local_10b = GVar3 != '\0' && local_10b;
  }
LAB_01653eb8:
  for (fs_code_without_precision[2]._4_4_ = 0; fs_code_without_precision[2]._4_4_ < 3;
      fs_code_without_precision[2]._4_4_ = fs_code_without_precision[2]._4_4_ + 1) {
    local_b8 = "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\n";
    fs_code_without_precision[0] =
         *(char **)(m_fs_code_declaration_without_precision +
                   (ulong)fs_code_without_precision[2]._4_4_ * 8);
    fs_code_without_precision[1] =
         "\nvoid main()\n{\n    color = texelFetch( sampler_buffer, 0 );\n}";
    fs_code_with_global_precision[3] = "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\n";
    local_f8 = "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\n";
    fs_code_with_global_precision[0] =
         *(char **)(m_fs_code_global_precision + (ulong)fs_code_without_precision[2]._4_4_ * 8);
    fs_code_with_global_precision[1] =
         *(char **)(m_fs_code_declaration_without_precision +
                   (ulong)fs_code_without_precision[2]._4_4_ * 8);
    fs_code_with_global_precision[2] =
         "\nvoid main()\n{\n    color = texelFetch( sampler_buffer, 0 );\n}";
    GVar3 = verifyShaderCompilationStatus(this,0x8b30,&local_b8,3,(uint)!bVar1);
    local_10c = GVar3 != '\0' && local_10b;
    GVar3 = verifyShaderCompilationStatus(this,0x8b30,fs_code_with_global_precision + 3,3,1);
    local_10e = false;
    if (GVar3 != '\0') {
      local_10e = local_10c;
    }
    GVar3 = verifyShaderCompilationStatus(this,0x8b30,&local_f8,4,1);
    local_10e = GVar3 != '\0' && local_10e;
    local_10b = local_10e;
  }
  if (local_10b) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureBufferPrecision::iterate(void)
{
	/* Skip if required extensions are not supported. */
	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	glu::ContextType contextType   = m_context.getRenderContext().getType();
	glw::GLboolean   test_passed   = true;
	glw::GLint		 expected_fail = glu::glslVersionIsES(m_glslVersion) ? GL_FALSE : GL_TRUE;

	/* Default precision qualifiers for opaque types are not supported prior to GLSL 4.50. */
	if (glu::contextSupports(contextType, glu::ApiType::core(4, 5)) ||
		glu::contextSupports(contextType, glu::ApiType::es(3, 1)))
	{
		/* Compute Shader Tests */
		for (glw::GLuint i = 0; i < 3; ++i) /* For each from the set {imageBuffer, iimageBuffer, uimageBuffer} */
		{
			const char* cs_code_without_precision[3] = { m_cs_code_head, m_cs_code_declaration_without_precision[i],
														 m_cs_code_body };

			const char* cs_code_with_precision[3] = { m_cs_code_head, m_cs_code_declaration_with_precision[i],
													  m_cs_code_body };

			const char* cs_code_with_global_precision[4] = { m_cs_code_head, m_cs_code_global_precision[i],
															 m_cs_code_declaration_without_precision[i],
															 m_cs_code_body };

			test_passed =
				verifyShaderCompilationStatus(GL_COMPUTE_SHADER, cs_code_without_precision, 3, expected_fail) &&
				test_passed;
			test_passed =
				verifyShaderCompilationStatus(GL_COMPUTE_SHADER, cs_code_with_precision, 3, GL_TRUE) && test_passed;
			test_passed = verifyShaderCompilationStatus(GL_COMPUTE_SHADER, cs_code_with_global_precision, 4, GL_TRUE) &&
						  test_passed;
		}
	}

	/* Fragment Shader Tests */
	for (glw::GLuint i = 0; i < 3; ++i) /* For each from the set {samplerBuffer, isamplerBuffer, usamplerBuffer} */
	{
		const char* fs_code_without_precision[3] = { m_fs_code_head, m_fs_code_declaration_without_precision[i],
													 m_fs_code_body };

		const char* fs_code_with_precision[3] = { m_fs_code_head, m_fs_code_declaration_with_precision[i],
												  m_fs_code_body };

		const char* fs_code_with_global_precision[4] = { m_fs_code_head, m_fs_code_global_precision[i],
														 m_fs_code_declaration_without_precision[i], m_fs_code_body };

		test_passed = verifyShaderCompilationStatus(GL_FRAGMENT_SHADER, fs_code_without_precision, 3, expected_fail) &&
					  test_passed;
		test_passed =
			verifyShaderCompilationStatus(GL_FRAGMENT_SHADER, fs_code_with_precision, 3, GL_TRUE) && test_passed;
		test_passed =
			verifyShaderCompilationStatus(GL_FRAGMENT_SHADER, fs_code_with_global_precision, 4, GL_TRUE) && test_passed;
	}

	if (test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}